

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool_test.cc
# Opt level: O3

void __thiscall TokenPoolTestTwoTokens::Run(TokenPoolTestTwoTokens *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  ssize_t sVar4;
  
  anon_unknown.dwarf_1fdbd4::TokenPoolTest::CreatePool
            (&this->super_TokenPoolTest,"foo --jobserver-auth=%d,%d bar",false);
  bVar2 = testing::Test::Check
                    (g_current_test,(this->super_TokenPoolTest).tokens_ != (TokenPool *)0x0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/tokenpool_test.cc"
                     ,0xbc,"__null != tokens_");
  if (bVar2) {
    testing::Test::Check
              (g_current_test,(bool)(-((this->super_TokenPoolTest).load_avg_ == -1.23456789) & 1),
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/tokenpool_test.cc"
               ,0xbd,"kLoadAverageDefault == load_avg_");
    pTVar1 = g_current_test;
    iVar3 = (*((this->super_TokenPoolTest).tokens_)->_vptr_TokenPool[2])();
    testing::Test::Check
              (pTVar1,SUB41(iVar3,0),
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/tokenpool_test.cc"
               ,0xc0,"tokens_->Acquire()");
    (*((this->super_TokenPoolTest).tokens_)->_vptr_TokenPool[3])();
    pTVar1 = g_current_test;
    iVar3 = (*((this->super_TokenPoolTest).tokens_)->_vptr_TokenPool[2])();
    testing::Test::Check
              (pTVar1,(bool)((byte)iVar3 ^ 1),
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/tokenpool_test.cc"
               ,0xc2,"tokens_->Acquire()");
    pTVar1 = g_current_test;
    sVar4 = write((this->super_TokenPoolTest).fds_[1],"T",1);
    bVar2 = testing::Test::Check
                      (pTVar1,sVar4 == 1,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/tokenpool_test.cc"
                       ,0xca,"1u == write(fds_[1], \"T\", 1)");
    pTVar1 = g_current_test;
    if (bVar2) {
      iVar3 = (*((this->super_TokenPoolTest).tokens_)->_vptr_TokenPool[2])();
      testing::Test::Check
                (pTVar1,SUB41(iVar3,0),
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/tokenpool_test.cc"
                 ,0xcc,"tokens_->Acquire()");
      (*((this->super_TokenPoolTest).tokens_)->_vptr_TokenPool[3])();
      pTVar1 = g_current_test;
      iVar3 = (*((this->super_TokenPoolTest).tokens_)->_vptr_TokenPool[2])();
      testing::Test::Check
                (pTVar1,(bool)((byte)iVar3 ^ 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/tokenpool_test.cc"
                 ,0xce,"tokens_->Acquire()");
      (*((this->super_TokenPoolTest).tokens_)->_vptr_TokenPool[4])();
      pTVar1 = g_current_test;
      iVar3 = (*((this->super_TokenPoolTest).tokens_)->_vptr_TokenPool[2])();
      testing::Test::Check
                (pTVar1,SUB41(iVar3,0),
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/tokenpool_test.cc"
                 ,0xd2,"tokens_->Acquire()");
      (*((this->super_TokenPoolTest).tokens_)->_vptr_TokenPool[4])();
      pTVar1 = g_current_test;
      iVar3 = (*((this->super_TokenPoolTest).tokens_)->_vptr_TokenPool[2])();
      testing::Test::Check
                (pTVar1,SUB41(iVar3,0),
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/tokenpool_test.cc"
                 ,0xd6,"tokens_->Acquire()");
      pTVar1 = g_current_test;
      sVar4 = read((this->super_TokenPoolTest).fds_[0],(this->super_TokenPoolTest).buf_,0x400);
      testing::Test::Check
                (pTVar1,sVar4 == 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/tokenpool_test.cc"
                 ,0xde,"1u == read(fds_[0], buf_, sizeof(buf_))");
      pTVar1 = g_current_test;
      iVar3 = (*((this->super_TokenPoolTest).tokens_)->_vptr_TokenPool[2])();
      testing::Test::Check
                (pTVar1,SUB41(iVar3,0),
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/tokenpool_test.cc"
                 ,0xe2,"tokens_->Acquire()");
      return;
    }
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(TokenPoolTest, TwoTokens) {
  CreateDefaultPool();

  ASSERT_NE(NULL, tokens_);
  EXPECT_EQ(kLoadAverageDefault, load_avg_);

  // implicit token
  EXPECT_TRUE(tokens_->Acquire());
  tokens_->Reserve();
  EXPECT_FALSE(tokens_->Acquire());

  // jobserver offers 2nd token
#ifdef _WIN32
  LONG previous;
  ASSERT_TRUE(ReleaseSemaphore(semaphore_, 1, &previous));
  ASSERT_EQ(0, previous);
#else
  ASSERT_EQ(1u, write(fds_[1], "T", 1));
#endif
  EXPECT_TRUE(tokens_->Acquire());
  tokens_->Reserve();
  EXPECT_FALSE(tokens_->Acquire());

  // release 2nd token
  tokens_->Release();
  EXPECT_TRUE(tokens_->Acquire());

  // release implict token - must return 2nd token back to jobserver
  tokens_->Release();
  EXPECT_TRUE(tokens_->Acquire());

  // there must be one token available
#ifdef _WIN32
  EXPECT_EQ(WAIT_OBJECT_0, WaitForSingleObject(semaphore_, 0));
  EXPECT_TRUE(ReleaseSemaphore(semaphore_, 1, &previous));
  EXPECT_EQ(0, previous);
#else
  EXPECT_EQ(1u, read(fds_[0], buf_, sizeof(buf_)));
#endif

  // implicit token
  EXPECT_TRUE(tokens_->Acquire());
}